

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelets.cpp
# Opt level: O0

void lts2::InverseWaveletTransform2D
               (Mat *src,Mat *dest,double *P,double *Q,int fsize,int *ww,int *wh)

{
  pointer *this;
  int iVar1;
  ostream *this_00;
  ulong uVar2;
  size_type sVar3;
  reference pvVar4;
  _OutputArray local_e8;
  _InputArray local_d0;
  int local_b8;
  int local_b4;
  int k_1;
  int k;
  int b;
  int local_a4;
  int height;
  int width;
  _InputArray local_78;
  undefined1 local_60 [8];
  vector<cv::Mat,_std::allocator<cv::Mat>_> components;
  Size_<int> local_40;
  Size imageSize;
  int *ww_local;
  int fsize_local;
  double *Q_local;
  double *P_local;
  Mat *dest_local;
  Mat *src_local;
  
  imageSize = (Size)ww;
  if (*(long *)(src + 0x10) == 0) {
    this_00 = std::operator<<((ostream *)&std::cerr,"InverseWaveletTransform2D() src == NULL");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  else {
    cv::MatSize::operator()((MatSize *)&local_40);
    this = &components.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
    cv::Size_<int>::Size_((Size_<int> *)this,&local_40);
    iVar1 = cv::Mat::type(src);
    cv::Mat::create(dest,this,iVar1);
    std::vector<cv::Mat,_std::allocator<cv::Mat>_>::vector
              ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)local_60);
    cv::_InputArray::_InputArray(&local_78,src);
    cv::_OutputArray::_OutputArray
              ((_OutputArray *)&height,(vector<cv::Mat,_std::allocator<cv::Mat>_> *)local_60);
    cv::split(&local_78,(_OutputArray *)&height);
    cv::_OutputArray::~_OutputArray((_OutputArray *)&height);
    cv::_InputArray::~_InputArray(&local_78);
    local_a4 = *(int *)imageSize;
    b = *wh;
    if ((local_a4 == 0) || (b == 0)) {
      k = 1;
    }
    else {
      for (; local_a4 <= local_40.width && b <= local_40.height; local_a4 = local_a4 << 1) {
        for (k_1 = 0; uVar2 = (ulong)k_1,
            sVar3 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::size
                              ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)local_60), uVar2 < sVar3
            ; k_1 = k_1 + 1) {
          for (local_b4 = 0; local_b4 < local_a4; local_b4 = local_b4 + 1) {
            pvVar4 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::at
                               ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)local_60,(long)k_1);
            Wavegeneral_v(pvVar4,local_b4,b,-1,P,Q,fsize);
          }
          for (local_b8 = 0; local_b8 < b; local_b8 = local_b8 + 1) {
            pvVar4 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::at
                               ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)local_60,(long)k_1);
            Wavegeneral_h(pvVar4,local_b8,local_a4,-1,P,Q,fsize);
          }
        }
        b = b << 1;
      }
      cv::_InputArray::_InputArray(&local_d0,(vector<cv::Mat,_std::allocator<cv::Mat>_> *)local_60);
      cv::_OutputArray::_OutputArray(&local_e8,dest);
      cv::merge(&local_d0,&local_e8);
      cv::_OutputArray::~_OutputArray(&local_e8);
      cv::_InputArray::~_InputArray(&local_d0);
      k = 0;
    }
    std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector
              ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)local_60);
  }
  return;
}

Assistant:

void lts2::InverseWaveletTransform2D(const cv::Mat& src, cv::Mat& dest, double *P, double *Q, int fsize, int *ww, int *wh)
{
  if (!src.data) {
    std::cerr << "InverseWaveletTransform2D() src == NULL" << std::endl;
    return;
  }
	
  cv::Size imageSize = src.size();
    
  dest.create(imageSize, src.type());
	
//	int width = imageSize.width; //XBDW(src)-XBUP(src);
//	int height = imageSize.height; //YBDW(src)-YBUP(src);
	
  std::vector<cv::Mat> components;
  cv::split(src, components);
	
  int width = *ww; 
  int height = *wh;
	
  if (width == 0 || height == 0)
    return;
    
  while(width <= imageSize.width && height <= imageSize.height) 
  {
    for(int b = 0; b < components.size(); ++b) 
    {  
      for(int k = 0; k < width; ++k)
        Wavegeneral_v(components.at(b), k, height, -1, P, Q, fsize);
      for(int k = 0; k < height; ++k)
        Wavegeneral_h(components.at(b), k, width, -1, P, Q, fsize);
    }
    width *= 2;
    height *= 2;
  }
    
  cv::merge(components, dest);
}